

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

int read_setting_i(settings_r *handle,char *key,int defvalue)

{
  void *pvVar1;
  char *__nptr;
  skeyval tmp;
  char *local_20 [2];
  
  local_20[0] = key;
  if (handle != (settings_r *)0x0) {
    pvVar1 = find234(handle->t,local_20,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      __nptr = *(char **)((long)pvVar1 + 8);
      if (__nptr == (char *)0x0) {
        __assert_fail("val != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/storage.c"
                      ,0x1bd,"int read_setting_i(settings_r *, const char *, int)");
      }
      goto LAB_001357e6;
    }
  }
  __nptr = get_setting(key);
LAB_001357e6:
  if (__nptr != (char *)0x0) {
    defvalue = atoi(__nptr);
  }
  return defvalue;
}

Assistant:

int read_setting_i(settings_r *handle, const char *key, int defvalue)
{
    const char *val;
    struct skeyval tmp, *kv;

    tmp.key = key;
    if (handle != NULL &&
        (kv = find234(handle->t, &tmp, NULL)) != NULL) {
        val = kv->value;
        assert(val != NULL);
    } else
        val = get_setting(key);

    if (!val)
        return defvalue;
    else
        return atoi(val);
}